

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O3

int chacha20_poly1305_open_gather
              (uint8_t *key,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len,size_t tag_len)

{
  uint32_t uVar1;
  int iVar2;
  int line;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  if (nonce_len == 0xc) {
    if (in_tag_len == tag_len) {
      if (in_len < 0x3fffffffc0) {
        uVar1 = OPENSSL_get_ia32cap(1);
        if ((uVar1 >> 0x13 & 1) == 0) {
          calc_tag((uint8_t *)&local_68,key,nonce,ad,ad_len,in,in_len,(uint8_t *)0x0,0);
          CRYPTO_chacha_20(out,in,in_len,key,nonce,1);
        }
        else {
          local_68 = *(undefined8 *)key;
          uStack_60 = *(undefined8 *)(key + 8);
          local_58 = *(undefined8 *)(key + 0x10);
          uStack_50 = *(undefined8 *)(key + 0x18);
          local_48 = 0;
          local_44 = *(undefined8 *)nonce;
          local_3c = *(undefined4 *)(nonce + 8);
          uVar1 = OPENSSL_get_ia32cap(2);
          if ((~uVar1 & 0x120) == 0) {
            chacha20_poly1305_open_avx2();
          }
          else {
            chacha20_poly1305_open_sse41(out,in,in_len,ad,ad_len,&local_68);
          }
        }
        iVar2 = CRYPTO_memcmp(&local_68,in_tag,in_tag_len);
        if (iVar2 == 0) {
          return 1;
        }
        iVar2 = 0x65;
        line = 0x103;
      }
      else {
        iVar2 = 0x75;
        line = 0xf3;
      }
    }
    else {
      iVar2 = 0x65;
      line = 0xe7;
    }
  }
  else {
    iVar2 = 0x79;
    line = 0xe2;
  }
  ERR_put_error(0x1e,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                ,line);
  return 0;
}

Assistant:

static int chacha20_poly1305_open_gather(
    const uint8_t *key, uint8_t *out, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *in_tag,
    size_t in_tag_len, const uint8_t *ad, size_t ad_len, size_t tag_len) {
  if (nonce_len != 12) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  if (in_tag_len != tag_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  // |CRYPTO_chacha_20| uses a 32-bit block counter. Therefore we disallow
  // individual operations that work on more than 256GB at a time.
  // |in_len_64| is needed because, on 32-bit platforms, size_t is only
  // 32-bits and this produces a warning because it's always false.
  // Casting to uint64_t inside the conditional is not sufficient to stop
  // the warning.
  const uint64_t in_len_64 = in_len;
  if (in_len_64 >= (UINT64_C(1) << 32) * 64 - 64) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  union chacha20_poly1305_open_data data;
  if (chacha20_poly1305_asm_capable()) {
    OPENSSL_memcpy(data.in.key, key, 32);
    data.in.counter = 0;
    OPENSSL_memcpy(data.in.nonce, nonce, 12);
    chacha20_poly1305_open(out, in, in_len, ad, ad_len, &data);
  } else {
    calc_tag(data.out.tag, key, nonce, ad, ad_len, in, in_len, NULL, 0);
    CRYPTO_chacha_20(out, in, in_len, key, nonce, 1);
  }

  if (CRYPTO_memcmp(data.out.tag, in_tag, tag_len) != 0) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  return 1;
}